

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

void update_thresh_freq_fact
               (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,MV_REFERENCE_FRAME ref_frame,
               THR_MODES best_mode_idx,PREDICTION_MODE mode)

{
  byte bVar1;
  int iVar2;
  int *piVar3;
  char in_CL;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  byte in_R8B;
  PREDICTION_MODE in_R9B;
  int *freq_fact;
  BLOCK_SIZE bs;
  BLOCK_SIZE max_size;
  BLOCK_SIZE min_size;
  THR_MODES thr_mode_idx;
  int local_48;
  byte local_44;
  byte local_40;
  byte local_18;
  
  iVar2 = mode_offset(in_R9B);
  bVar1 = mode_idx[in_CL][iVar2];
  if ((int)(in_DL - 3) < 1) {
    local_40 = 0;
  }
  else {
    local_40 = in_DL - 3;
  }
  local_18 = local_40;
  if (in_DL + 6 < 0xf) {
    local_44 = in_DL + 6;
  }
  else {
    local_44 = 0xf;
  }
  for (; local_18 <= local_44; local_18 = local_18 + 3) {
    piVar3 = (int *)(in_RSI + 0x18c14 + (ulong)local_18 * 0x2a4 + (ulong)bVar1 * 4);
    if (bVar1 == in_R8B) {
      *piVar3 = *piVar3 - (*piVar3 >> 4);
    }
    else {
      if (*piVar3 + 1 < *(int *)(in_RDI + 0x60a88) * 0x40) {
        local_48 = *piVar3 + 1;
      }
      else {
        local_48 = *(int *)(in_RDI + 0x60a88) << 6;
      }
      *piVar3 = local_48;
    }
  }
  return;
}

Assistant:

static inline void update_thresh_freq_fact(AV1_COMP *cpi, MACROBLOCK *x,
                                           BLOCK_SIZE bsize,
                                           MV_REFERENCE_FRAME ref_frame,
                                           THR_MODES best_mode_idx,
                                           PREDICTION_MODE mode) {
  const THR_MODES thr_mode_idx = mode_idx[ref_frame][mode_offset(mode)];
  const BLOCK_SIZE min_size = AOMMAX(bsize - 3, BLOCK_4X4);
  const BLOCK_SIZE max_size = AOMMIN(bsize + 6, BLOCK_128X128);
  for (BLOCK_SIZE bs = min_size; bs <= max_size; bs += 3) {
    int *freq_fact = &x->thresh_freq_fact[bs][thr_mode_idx];
    if (thr_mode_idx == best_mode_idx) {
      *freq_fact -= (*freq_fact >> 4);
    } else {
      *freq_fact =
          AOMMIN(*freq_fact + RD_THRESH_INC,
                 cpi->sf.inter_sf.adaptive_rd_thresh * RD_THRESH_MAX_FACT);
    }
  }
}